

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi.c
# Opt level: O1

void lws_wsi_mux_dump_waiting_children(lws *wsi)

{
  lws *plVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  _lws_log(8,"%s: %p: children waiting for POLLOUT service:\n","lws_wsi_mux_dump_waiting_children",
           wsi);
  for (plVar1 = (wsi->mux).child_list; plVar1 != (lws *)0x0; plVar1 = (plVar1->mux).sibling_list) {
    uVar2 = 0x2a;
    if ((plVar1->mux).requested_POLLOUT == '\0') {
      uVar2 = 0x20;
    }
    pcVar3 = "noprotocol";
    if (plVar1->protocol != (lws_protocols *)0x0) {
      pcVar3 = plVar1->protocol->name;
    }
    _lws_log(8,"  %c %p: sid %u: 0x%x %s %s\n",uVar2,plVar1,(ulong)(plVar1->mux).my_sid,
             (ulong)(ushort)plVar1->wsistate,plVar1->role_ops->name,pcVar3);
  }
  return;
}

Assistant:

void
lws_wsi_mux_dump_waiting_children(struct lws *wsi)
{
#if defined(_DEBUG)
	lwsl_info("%s: %p: children waiting for POLLOUT service:\n",
		  __func__, wsi);

	wsi = wsi->mux.child_list;
	while (wsi) {
		lwsl_info("  %c %p: sid %u: 0x%x %s %s\n",
			  wsi->mux.requested_POLLOUT ? '*' : ' ',
			  wsi, wsi->mux.my_sid, lwsi_state(wsi),
			  wsi->role_ops->name,
			  wsi->protocol ? wsi->protocol->name : "noprotocol");

		wsi = wsi->mux.sibling_list;
	}
#endif
}